

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  int iVar1;
  ImFontAtlasCustomRect *pIVar2;
  ImFont **ppIVar3;
  ImFontGlyph *pIVar4;
  ImFontAtlas *in_RDI;
  int j;
  ImWchar ellipsis_variants [2];
  ImFont *font;
  int i_2;
  int i_1;
  ImVec2 uv1;
  ImVec2 uv0;
  ImFontAtlasCustomRect *r;
  int i;
  int in_stack_ffffffffffffffac;
  ImVector<ImFontAtlasCustomRect> *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImFont *this;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  int iVar5;
  float in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  ImWchar in_stack_ffffffffffffffde;
  ImVec2 in_stack_ffffffffffffffe0;
  float in_stack_fffffffffffffff0;
  int iVar6;
  
  ImFontAtlasBuildRenderDefaultTexData
            ((ImFontAtlas *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  for (iVar6 = 0; iVar6 < (in_RDI->CustomRects).Size; iVar6 = iVar6 + 1) {
    pIVar2 = ImVector<ImFontAtlasCustomRect>::operator[]
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if ((pIVar2->Font != (ImFont *)0x0) && (pIVar2->GlyphID != 0)) {
      if (pIVar2->Font->ContainerAtlas != in_RDI) {
        __assert_fail("r.Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                      ,0x8f9,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8);
      ImFontAtlas::CalcCustomRectUV
                ((ImFontAtlas *)in_stack_ffffffffffffffe0,
                 (ImFontAtlasCustomRect *)
                 CONCAT26(in_stack_ffffffffffffffde,
                          CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      ImFont::AddGlyph((ImFont *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde,
                       in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                       ,(float)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       SUB84(in_stack_ffffffffffffffc8,0),in_stack_ffffffffffffffc4,
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_fffffffffffffff0
                      );
    }
  }
  for (iVar5 = 0; iVar5 < (in_RDI->Fonts).Size; iVar5 = iVar5 + 1) {
    ppIVar3 = ImVector<ImFont_*>::operator[]
                        ((ImVector<ImFont_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (((*ppIVar3)->DirtyLookupTables & 1U) != 0) {
      ImVector<ImFont_*>::operator[]
                ((ImVector<ImFont_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      ImFont::BuildLookupTable((ImFont *)CONCAT44(iVar6,in_stack_fffffffffffffff0));
    }
  }
  iVar6 = 0;
  do {
    iVar5 = iVar6;
    iVar1 = ImVector<ImFont_*>::size(&in_RDI->Fonts);
    if (iVar1 <= iVar6) {
      return;
    }
    ppIVar3 = ImVector<ImFont_*>::operator[]
                        ((ImVector<ImFont_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    this = *ppIVar3;
    if (this->EllipsisChar == 0xffff) {
      for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
        pIVar4 = ImFont::FindGlyphNoFallback
                           (this,*(ImWchar *)(&stack0xffffffffffffffc4 + (long)iVar6 * 2));
        if (pIVar4 != (ImFontGlyph *)0x0) {
          this->EllipsisChar = *(ImWchar *)(&stack0xffffffffffffffc4 + (long)iVar6 * 2);
          break;
        }
      }
    }
    iVar6 = iVar5 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.GlyphID == 0)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.GlyphID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}